

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWidget * __thiscall
QWidgetPrivate::childAt_helper(QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  QWExtra *pQVar4;
  char cVar5;
  QWidget *pQVar6;
  long in_FS_OFFSET;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QPointF local_48;
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&this->field_0x28 != 0) {
    lVar2 = *(long *)&this->field_0x8;
    lVar3 = *(long *)(lVar2 + 0x20);
    uVar1 = *(undefined8 *)(lVar3 + 0x1c);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)(lVar3 + 0x14);
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    auVar11 = auVar11 ^ auVar13;
    auVar12._0_4_ = auVar11._0_4_ + (int)uVar1;
    auVar12._4_4_ = auVar11._4_4_ + (int)((ulong)uVar1 >> 0x20);
    auVar12._8_4_ = auVar11._8_4_;
    auVar12._12_4_ = auVar11._12_4_;
    auVar8._0_4_ = -(uint)(-1 < auVar12._0_4_);
    auVar8._4_4_ = -(uint)(-1 < auVar12._4_4_);
    auVar8._8_4_ = -(uint)(-1 < auVar12._8_4_);
    auVar8._12_4_ = -(uint)(-1 < auVar12._12_4_);
    auVar8 = auVar8 ^ auVar13 | auVar12 & auVar8;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    auVar9._0_8_ = auVar8._0_8_;
    auVar9._8_4_ = auVar8._4_4_;
    auVar9._12_4_ = -(uint)(auVar8._4_4_ < 0);
    uVar7 = CONCAT44(-(uint)(auVar8._0_4_ < 0),auVar8._0_4_) + 1;
    uVar10 = auVar9._8_8_ - auVar13._8_8_;
    local_38 = ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar7 & 0xffffffff | 0x4330000000000000);
    dStack_30 = ((double)(uVar10 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(uVar10 & 0xffffffff | 0x4330000000000000);
    cVar5 = QRectF::contains(&local_48);
    if ((cVar5 != '\0') &&
       ((((pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>
                    ._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl, pQVar4 == (QWExtra *)0x0
          || ((pQVar4->field_0x7c & 0x80) == 0)) ||
         ((*(byte *)(*(long *)(lVar2 + 8) + 0x244) & 0x80) != 0)) ||
        (cVar5 = QRegion::contains((QPoint *)&pQVar4->mask), cVar5 != '\0')))) {
      pQVar6 = childAtRecursiveHelper(this,p,ignoreChildrenInDestructor);
      goto LAB_0030c09f;
    }
  }
  pQVar6 = (QWidget *)0x0;
LAB_0030c09f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar6;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QWidgetPrivate::childAt_helper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    if (children.isEmpty())
        return nullptr;

    if (!pointInsideRectAndMask(p))
        return nullptr;
    return childAtRecursiveHelper(p, ignoreChildrenInDestructor);
}